

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DateFormatSymbols::setMonths
          (DateFormatSymbols *this,UnicodeString *monthsArray,int32_t count)

{
  UnicodeString *this_00;
  UnicodeString *pUVar1;
  UnicodeString *p;
  int32_t count_local;
  UnicodeString *monthsArray_local;
  DateFormatSymbols *this_local;
  
  if ((this->fMonths != (UnicodeString *)0x0) &&
     (pUVar1 = this->fMonths, pUVar1 != (UnicodeString *)0x0)) {
    this_00 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    p = monthsArray;
    while (pUVar1 != this_00) {
      this_00 = this_00 + -1;
      icu_63::UnicodeString::~UnicodeString(this_00);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),p);
  }
  pUVar1 = newUnicodeStringArray((long)count);
  this->fMonths = pUVar1;
  uprv_arrayCopy(monthsArray,this->fMonths,count);
  this->fMonthsCount = count;
  return;
}

Assistant:

void
DateFormatSymbols::setMonths(const UnicodeString* monthsArray, int32_t count)
{
    // delete the old list if we own it
    if (fMonths)
        delete[] fMonths;

    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)
    fMonths = newUnicodeStringArray(count);
    uprv_arrayCopy( monthsArray,fMonths,count);
    fMonthsCount = count;
}